

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

int __thiscall TPZFMatrix<double>::Substitution(TPZFMatrix<double> *this,TPZFMatrix<double> *B)

{
  double dVar1;
  ulong uVar2;
  ulong uVar3;
  double *pdVar4;
  double *pdVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  
  if ((this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed != '\x01') {
    Error("TPZFMatrix::Decompose_LU substitution called for a wrongly decomposed matrix",(char *)0x0
         );
  }
  uVar2 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  uVar14 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  uVar3 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if (uVar2 != uVar3) {
    Error("SubstitutionLU <incompatible dimensions>",(char *)0x0);
  }
  uVar7 = 0;
  if ((long)uVar14 < 1) {
    uVar14 = uVar7;
  }
  uVar8 = 0;
  if (0 < (long)uVar2) {
    uVar8 = uVar2;
  }
  for (; uVar7 != uVar8; uVar7 = uVar7 + 1) {
    for (uVar10 = 0; uVar10 != uVar14; uVar10 = uVar10 + 1) {
      lVar11 = (uVar10 & 0xffffffff) * uVar2;
      pdVar4 = this->fElem;
      for (uVar12 = 0; uVar7 != uVar12; uVar12 = uVar12 + 1) {
        pdVar5 = B->fElem;
        pdVar5[lVar11 + uVar7] =
             pdVar5[lVar11 + uVar7] -
             pdVar4[uVar7 + (uVar12 & 0xffffffff) * uVar3] *
             *(double *)((long)pdVar5 + uVar12 * 8 + (uVar10 & 0xffffffff) * uVar2 * 8);
      }
    }
  }
  for (uVar7 = 0; uVar7 != uVar14; uVar7 = uVar7 + 1) {
    lVar11 = ((uVar7 & 0xffffffff) + 1) * uVar2;
    lVar13 = (uVar7 & 0xffffffff) * uVar2;
    uVar8 = uVar2;
    while (0 < (long)uVar8) {
      uVar10 = uVar8 - 1;
      pdVar4 = this->fElem;
      lVar9 = lVar11;
      for (; (long)uVar8 < (long)uVar2; uVar8 = uVar8 + 1) {
        pdVar5 = B->fElem;
        pdVar5[lVar13 + uVar10] =
             pdVar5[lVar13 + uVar10] - pdVar4[uVar10 + (uVar8 & 0xffffffff) * uVar3] * pdVar5[lVar9]
        ;
        lVar9 = lVar9 + 1;
      }
      lVar9 = (uVar10 & 0xffffffff) * uVar3 + uVar10;
      dVar1 = this->fElem[lVar9];
      if ((ABS(dVar1) < 1e-12) &&
         ((pcVar6 = "static::BackSub(SubstitutionLU) <Matrix is singular", dVar1 == 0.0 ||
          (pcVar6 = "static::BackSub(SubstitutionLU) <Matrix is singular even after Power Plus...",
          1e-12 < ABS(B->fElem[lVar13 + uVar10] - dVar1))))) {
        Error(pcVar6 + 8,(char *)0x0);
      }
      B->fElem[lVar13 + uVar10] = B->fElem[lVar13 + uVar10] / this->fElem[lVar9];
      lVar11 = lVar11 + -1;
      uVar8 = uVar10;
    }
  }
  return 1;
}

Assistant:

int TPZFMatrix<TVar>::Substitution( TPZFMatrix<TVar> *B ) const {
#ifdef USING_LAPACK    
	if (this->fDecomposed != ELUPivot) {
		Error("TPZFMatrix::Decompose_LU substitution called for a wrongly decomposed matrix");
	}
#else
	if(this->fDecomposed != ELU) {
        Error("TPZFMatrix::Decompose_LU substitution called for a wrongly decomposed matrix");
    }
#endif
    int64_t rowb = B->Rows();
    int64_t colb = B->Cols();
    int64_t row = this->Rows();
    if ( rowb != this->Rows() ) Error( "SubstitutionLU <incompatible dimensions>" );
    
    
    int64_t i,j;
    for ( i = 0; i < rowb; i++ ) {
        for ( int64_t col = 0; col < colb; col++ )
            for (j = 0; j < i; j++ )
                //B->PutVal( i, col, B->GetVal(i, col) - GetVal(i, j) * B->GetVal(j, col) );
                PUTVAL(B, rowb, i, col, GETVAL(B, rowb, i, col) - GETVAL(this, row, i, j) * GETVAL(B, rowb, j, col));
    }
    
    for (int64_t col=0; col<colb; col++){
        for ( i = rowb-1; i >= 0; i-- ) {
            for (j = i+1; j < rowb ; j++ )
                //B->PutVal( i, col, B->GetVal(i, col) - GetVal(i, j) * B->GetVal(j, col) );
                PUTVAL(B, rowb, i, col, GETVAL(B, rowb, i, col) - GETVAL(this, row, i, j) * GETVAL(B, rowb, j, col));
            if ( IsZero( GETVAL(this, row, i, i)/*GetVal(i, i)*/ ) ) {
                if (fabs(GETVAL(this, row, i, i)/*GetVal(i, i)*/) > 0.){
                    TVar diff = GETVAL(B, rowb, i, col) - GETVAL(this, row, i, i)/*B->GetVal(i, col) - GetVal(i, i)*/;
                    if (fabs(diff) > 1e-12){
                        Error( "BackSub(SubstitutionLU) <Matrix is singular even after Power Plus..." );
                    }
                }else  Error( "BackSub(SubstitutionLU) <Matrix is singular" );
            }
            PUTVAL(B, rowb, i, col, GETVAL(B, rowb, i, col)/GETVAL(this, row, i, i));
            //B->PutVal( i, col, B->GetVal( i, col) / GetVal(i, i) );
        }
    }
    return( 1 );
    
}